

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  long lVar1;
  int *piVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  void *pvVar7;
  ImGuiTable *table;
  void *pvVar8;
  long lVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  int iVar12;
  ImGuiContext *ctx;
  void *pvVar13;
  uint uVar14;
  bool *pbVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ImVector<ImGuiListClipperRange> *pIVar23;
  int i;
  long lVar24;
  ImGuiWindow *pIVar25;
  undefined8 *puVar26;
  bool bVar27;
  ImGuiListClipperRange local_58;
  ImVector<ImGuiListClipperRange> *local_48;
  ImGuiWindow *local_40;
  float local_34;
  
  pIVar10 = GImGui;
  local_34 = this->ItemsHeight;
  pIVar25 = GImGui->CurrentWindow;
  pvVar7 = this->TempData;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  pIVar11 = GImGui;
  uVar6 = this->ItemsCount;
  if (uVar6 != 0) {
    if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
      pbVar15 = &GImGui->CurrentWindow->SkipItems;
    }
    else {
      pbVar15 = &GImGui->CurrentTable->HostSkipItems;
    }
    if (*pbVar15 == false) {
      if (*(int *)((long)pvVar7 + 0xc) == 0 && table != (ImGuiTable *)0x0) {
        if (table->IsUnfrozenRows == true) {
          fVar3 = this->ItemsHeight;
LAB_001deb0c:
          this->StartPosY = (pIVar25->DC).CursorPos.y;
          if (0.0 < fVar3) {
            iVar21 = this->DisplayEnd;
LAB_001debf6:
            if (pIVar10->LogEnabled == true) {
              iVar12 = *(int *)((long)pvVar7 + 0x18);
              if (iVar12 == *(int *)((long)pvVar7 + 0x1c)) {
                if (iVar12 == 0) {
                  iVar18 = 8;
                }
                else {
                  iVar18 = iVar12 / 2 + iVar12;
                }
                iVar22 = iVar12 + 1;
                if (iVar12 + 1 < iVar18) {
                  iVar22 = iVar18;
                }
                local_48 = (ImVector<ImGuiListClipperRange> *)CONCAT44(local_48._4_4_,iVar22);
                piVar2 = &(pIVar11->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + 1;
                local_40 = pIVar25;
                pvVar13 = (*GImAllocatorAllocFunc)((long)iVar22 * 0xc,GImAllocatorUserData);
                if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
                  memcpy(pvVar13,*(void **)((long)pvVar7 + 0x20),
                         (long)*(int *)((long)pvVar7 + 0x18) * 0xc);
                  pvVar8 = *(void **)((long)pvVar7 + 0x20);
                  if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + -1;
                  }
                  (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
                }
                *(void **)((long)pvVar7 + 0x20) = pvVar13;
                *(int *)((long)pvVar7 + 0x1c) = (int)local_48;
                iVar12 = *(int *)((long)pvVar7 + 0x18);
                pIVar25 = local_40;
              }
              else {
                pvVar13 = *(void **)((long)pvVar7 + 0x20);
              }
              *(ulong *)((long)pvVar13 + (long)iVar12 * 0xc) = (ulong)uVar6 << 0x20;
              *(undefined4 *)((long)pvVar13 + (long)iVar12 * 0xc + 8) = 0;
            }
            else {
              if (((pIVar10->NavMoveScoringItems == true) &&
                  (pIVar10->NavWindow != (ImGuiWindow *)0x0)) &&
                 (pIVar10->NavWindow->RootWindowForNav == pIVar25->RootWindowForNav)) {
                pIVar23 = (ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18);
                fVar3 = (pIVar10->NavScoringNoClipRect).Min.y;
                fVar4 = (pIVar10->NavScoringNoClipRect).Max.y;
                iVar12 = *(int *)((long)pvVar7 + 0x18);
                if (iVar12 == *(int *)((long)pvVar7 + 0x1c)) {
                  if (iVar12 == 0) {
                    iVar18 = 8;
                  }
                  else {
                    iVar18 = iVar12 / 2 + iVar12;
                  }
                  iVar22 = iVar12 + 1;
                  if (iVar12 + 1 < iVar18) {
                    iVar22 = iVar18;
                  }
                  piVar2 = &(pIVar11->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + 1;
                  local_48 = pIVar23;
                  local_40 = pIVar25;
                  pvVar13 = (*GImAllocatorAllocFunc)((long)iVar22 * 0xc,GImAllocatorUserData);
                  if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
                    memcpy(pvVar13,*(void **)((long)pvVar7 + 0x20),
                           (long)*(int *)((long)pvVar7 + 0x18) * 0xc);
                    pvVar8 = *(void **)((long)pvVar7 + 0x20);
                    if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                      *piVar2 = *piVar2 + -1;
                    }
                    (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
                  }
                  *(void **)((long)pvVar7 + 0x20) = pvVar13;
                  *(int *)((long)pvVar7 + 0x1c) = iVar22;
                  iVar12 = *(int *)((long)pvVar7 + 0x18);
                  pIVar23 = local_48;
                  pIVar25 = local_40;
                }
                else {
                  pvVar13 = *(void **)((long)pvVar7 + 0x20);
                }
                *(ulong *)((long)pvVar13 + (long)iVar12 * 0xc) = CONCAT44((int)fVar4,(int)fVar3);
                *(undefined4 *)((long)pvVar13 + (long)iVar12 * 0xc + 8) = 1;
                pIVar23->Size = pIVar23->Size + 1;
                bVar27 = true;
                if (((pIVar10->NavMoveFlags & 0x400) != 0) && (pIVar10->NavTabbingDir == -1)) {
                  local_58.Min = this->ItemsCount + -1;
                  local_58.Max = this->ItemsCount;
                  local_58.PosToIndexConvert = false;
                  local_58.PosToIndexOffsetMin = '\0';
                  local_58.PosToIndexOffsetMax = '\0';
                  local_58._11_1_ = 0;
                  ImVector<ImGuiListClipperRange>::push_back(pIVar23,&local_58);
                }
              }
              else {
                bVar27 = false;
              }
              if ((pIVar10->NavId != 0) && (pIVar25->NavLastIds[0] == pIVar10->NavId)) {
                fVar3 = (pIVar25->DC).CursorStartPos.y;
                local_58.Min = (int)(pIVar25->NavRectRel[0].Min.y + fVar3);
                local_58.Max = (int)(fVar3 + pIVar25->NavRectRel[0].Max.y);
                local_58.PosToIndexConvert = true;
                local_58.PosToIndexOffsetMin = '\0';
                local_58.PosToIndexOffsetMax = '\0';
                local_58._11_1_ = 0;
                ImVector<ImGuiListClipperRange>::push_back
                          ((ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18),&local_58);
              }
              iVar12 = 1;
              if (bVar27) {
                iVar12 = 0xff00;
                if (pIVar10->NavMoveClipDir != 2) {
                  iVar12 = 0;
                }
                iVar12 = (uint)(pIVar10->NavMoveClipDir == 3) * 0x10000 + iVar12 + 1;
              }
              fVar3 = (pIVar25->ClipRect).Min.y;
              fVar4 = (pIVar25->ClipRect).Max.y;
              iVar18 = *(int *)((long)pvVar7 + 0x18);
              if (iVar18 == *(int *)((long)pvVar7 + 0x1c)) {
                local_48 = (ImVector<ImGuiListClipperRange> *)CONCAT44(local_48._4_4_,iVar12);
                if (iVar18 == 0) {
                  iVar12 = 8;
                }
                else {
                  iVar12 = iVar18 / 2 + iVar18;
                }
                iVar22 = iVar18 + 1;
                if (iVar18 + 1 < iVar12) {
                  iVar22 = iVar12;
                }
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + 1;
                }
                local_40 = pIVar25;
                pvVar13 = (*GImAllocatorAllocFunc)((long)iVar22 * 0xc,GImAllocatorUserData);
                if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
                  memcpy(pvVar13,*(void **)((long)pvVar7 + 0x20),
                         (long)*(int *)((long)pvVar7 + 0x18) * 0xc);
                  pvVar8 = *(void **)((long)pvVar7 + 0x20);
                  if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar2 = *piVar2 + -1;
                  }
                  (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
                }
                *(void **)((long)pvVar7 + 0x20) = pvVar13;
                *(int *)((long)pvVar7 + 0x1c) = iVar22;
                iVar18 = *(int *)((long)pvVar7 + 0x18);
                pIVar25 = local_40;
                iVar12 = (int)local_48;
              }
              else {
                pvVar13 = *(void **)((long)pvVar7 + 0x20);
              }
              *(ulong *)((long)pvVar13 + (long)iVar18 * 0xc) = CONCAT44((int)fVar4,(int)fVar3);
              *(int *)((long)pvVar13 + (long)iVar18 * 0xc + 8) = iVar12;
            }
            iVar12 = *(int *)((long)pvVar7 + 0x18) + 1;
            *(int *)((long)pvVar7 + 0x18) = iVar12;
            if (0 < iVar12) {
              lVar16 = 8;
              lVar20 = 0;
              do {
                lVar24 = *(long *)((long)pvVar7 + 0x20);
                if (*(char *)(lVar24 + lVar16) == '\x01') {
                  fVar3 = (pIVar25->DC).CursorPos.y;
                  fVar4 = *(float *)((long)pvVar7 + 8);
                  fVar5 = this->ItemsHeight;
                  iVar18 = *(char *)(lVar24 + 1 + lVar16) + iVar21 +
                           (int)((((float)*(int *)(lVar24 + -8 + lVar16) - fVar3) - fVar4) / fVar5);
                  iVar12 = this->ItemsCount + -1;
                  if (iVar18 < iVar12) {
                    iVar12 = iVar18;
                  }
                  if (iVar18 < iVar21) {
                    iVar12 = iVar21;
                  }
                  *(int *)(lVar24 + -8 + lVar16) = iVar12;
                  lVar9 = *(long *)((long)pvVar7 + 0x20);
                  iVar22 = *(char *)(lVar9 + 2 + lVar16) + iVar21 +
                           (int)((((float)*(int *)(lVar24 + -4 + lVar16) - fVar3) - fVar4) / fVar5 +
                                0.999999);
                  iVar12 = *(int *)(lVar9 + -8 + lVar16);
                  iVar18 = this->ItemsCount;
                  if (iVar22 < this->ItemsCount) {
                    iVar18 = iVar22;
                  }
                  if (iVar22 <= iVar12) {
                    iVar18 = iVar12 + 1;
                  }
                  *(int *)(lVar9 + -4 + lVar16) = iVar18;
                  *(undefined1 *)(*(long *)((long)pvVar7 + 0x20) + lVar16) = 0;
                  iVar12 = *(int *)((long)pvVar7 + 0x18);
                }
                lVar20 = lVar20 + 1;
                lVar16 = lVar16 + 0xc;
              } while (lVar20 < iVar12);
            }
            iVar18 = *(int *)((long)pvVar7 + 0xc);
            if (1 < iVar12 - iVar18) {
              lVar16 = (long)iVar18;
              uVar17 = (ulong)(uint)(iVar12 - iVar18);
              do {
                lVar20 = lVar16 * 0xc;
                lVar24 = lVar16;
                do {
                  lVar9 = *(long *)((long)pvVar7 + 0x20);
                  if (*(int *)(lVar9 + 0xc + lVar20) < *(int *)(lVar9 + lVar20)) {
                    lVar1 = lVar9 + lVar20;
                    puVar26 = (undefined8 *)(lVar9 + lVar20);
                    local_58._8_4_ = *(undefined4 *)(puVar26 + 1);
                    local_58._0_8_ = *puVar26;
                    *(undefined4 *)(puVar26 + 1) = *(undefined4 *)(lVar1 + 0x14);
                    *puVar26 = *(undefined8 *)(lVar1 + 0xc);
                    *(undefined4 *)(lVar1 + 0x14) = local_58._8_4_;
                    *(undefined8 *)(lVar1 + 0xc) = local_58._0_8_;
                  }
                  lVar24 = lVar24 + 1;
                  lVar20 = lVar20 + 0xc;
                } while (lVar24 < (long)(uVar17 + lVar16 + -1));
                bVar27 = 2 < (long)uVar17;
                uVar17 = uVar17 - 1;
              } while (bVar27);
              iVar12 = *(int *)((long)pvVar7 + 0x18);
              while (iVar22 = iVar18, iVar18 = iVar22 + 1, iVar18 < iVar12) {
                lVar16 = *(long *)((long)pvVar7 + 0x20);
                lVar20 = (long)iVar22;
                uVar17 = (ulong)iVar18;
                iVar19 = *(int *)(lVar16 + uVar17 * 0xc);
                if (iVar19 <= *(int *)(lVar16 + 4 + lVar20 * 0xc)) {
                  piVar2 = (int *)(lVar16 + lVar20 * 0xc);
                  iVar12 = *piVar2;
                  if (iVar12 < iVar19) {
                    iVar19 = iVar12;
                  }
                  *piVar2 = iVar19;
                  lVar16 = *(long *)((long)pvVar7 + 0x20);
                  iVar12 = *(int *)(lVar16 + 4 + lVar20 * 0xc);
                  lVar24 = uVar17 * 0xc;
                  iVar18 = *(int *)(lVar16 + 4 + lVar24);
                  if (iVar18 < iVar12) {
                    iVar18 = iVar12;
                  }
                  *(int *)(lVar16 + 4 + lVar20 * 0xc) = iVar18;
                  memmove((void *)(*(long *)((long)pvVar7 + 0x20) + lVar24),
                          (void *)(*(long *)((long)pvVar7 + 0x20) + lVar24 + 0xc),
                          (~uVar17 + (long)*(int *)((long)pvVar7 + 0x18)) * 0xc);
                  iVar12 = *(int *)((long)pvVar7 + 0x18) + -1;
                  *(int *)((long)pvVar7 + 0x18) = iVar12;
                  iVar18 = iVar22;
                }
              }
            }
            goto LAB_001defa6;
          }
          pIVar23 = (ImVector<ImGuiListClipperRange> *)((long)pvVar7 + 0x18);
          local_58.Max = *(int *)((long)pvVar7 + 0x10) + 1;
          local_58.Min = *(int *)((long)pvVar7 + 0x10);
          local_58.PosToIndexConvert = false;
          local_58.PosToIndexOffsetMin = '\0';
          local_58.PosToIndexOffsetMax = '\0';
          local_58._11_1_ = 0;
          if (*(int *)((long)pvVar7 + 0x18) == 0) {
            if (*(int *)((long)pvVar7 + 0x1c) == 0) {
              piVar2 = &(pIVar11->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + 1;
              pvVar13 = (*GImAllocatorAllocFunc)(0x60,GImAllocatorUserData);
              if (*(void **)((long)pvVar7 + 0x20) != (void *)0x0) {
                memcpy(pvVar13,*(void **)((long)pvVar7 + 0x20),
                       (long)*(int *)((long)pvVar7 + 0x18) * 0xc);
                pvVar8 = *(void **)((long)pvVar7 + 0x20);
                if ((pvVar8 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                  piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar2 = *piVar2 + -1;
                }
                (*GImAllocatorFreeFunc)(pvVar8,GImAllocatorUserData);
              }
              *(void **)((long)pvVar7 + 0x20) = pvVar13;
              *(undefined4 *)((long)pvVar7 + 0x1c) = 8;
              lVar16 = (long)*(int *)((long)pvVar7 + 0x18);
            }
            else {
              pvVar13 = *(void **)((long)pvVar7 + 0x20);
              lVar16 = 0;
            }
            *(undefined4 *)((long)pvVar13 + lVar16 * 0xc + 8) = local_58._8_4_;
            *(undefined8 *)((long)pvVar13 + lVar16 * 0xc) = local_58._0_8_;
            pIVar23->Size = pIVar23->Size + 1;
          }
          else {
            ImVector<ImGuiListClipperRange>::insert
                      (pIVar23,*(ImGuiListClipperRange **)((long)pvVar7 + 0x20),&local_58);
          }
          iVar21 = *(int *)((long)pvVar7 + 0x10);
          if (*(int *)((long)pvVar7 + 0x10) < **(int **)((long)pvVar7 + 0x20)) {
            iVar21 = **(int **)((long)pvVar7 + 0x20);
          }
          this->DisplayStart = iVar21;
          iVar21 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4);
          iVar12 = this->ItemsCount;
          if (iVar21 < this->ItemsCount) {
            iVar12 = iVar21;
          }
          this->DisplayEnd = iVar12;
          *(undefined4 *)((long)pvVar7 + 0xc) = 1;
        }
        else {
          iVar21 = *(int *)((long)pvVar7 + 0x10);
          this->DisplayStart = iVar21;
          uVar14 = iVar21 + 1U;
          if ((int)uVar6 <= (int)(iVar21 + 1U)) {
            uVar14 = uVar6;
          }
          this->DisplayEnd = uVar14;
          if (iVar21 < (int)uVar6) {
            *(int *)((long)pvVar7 + 0x10) = *(int *)((long)pvVar7 + 0x10) + 1;
          }
        }
      }
      else {
        fVar3 = this->ItemsHeight;
        if (*(int *)((long)pvVar7 + 0xc) == 0) goto LAB_001deb0c;
        if (fVar3 <= 0.0) {
          iVar21 = this->DisplayEnd;
          this->ItemsHeight =
               ((pIVar25->DC).CursorPos.y - this->StartPosY) / (float)(iVar21 - this->DisplayStart);
          if ((16777216.0 <= ABS(this->StartPosY)) || (16777216.0 <= ABS((pIVar25->DC).CursorPos.y))
             ) {
            this->ItemsHeight = (pIVar25->DC).PrevLineSize.y + (pIVar10->Style).ItemSpacing.y;
          }
          goto LAB_001debf6;
        }
        iVar21 = this->DisplayEnd;
        iVar12 = *(int *)((long)pvVar7 + 0x18);
LAB_001defa6:
        if (iVar12 <= *(int *)((long)pvVar7 + 0xc)) {
          if (this->ItemsCount != 0x7fffffff) {
            ImGuiListClipper_SeekCursorForItem(this,this->ItemsCount);
          }
          goto LAB_001deabe;
        }
        iVar12 = *(int *)(*(long *)((long)pvVar7 + 0x20) + (long)*(int *)((long)pvVar7 + 0xc) * 0xc)
        ;
        iVar18 = iVar21;
        if (iVar21 < iVar12) {
          iVar18 = iVar12;
        }
        this->DisplayStart = iVar18;
        iVar22 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 +
                         (long)*(int *)((long)pvVar7 + 0xc) * 0xc);
        iVar19 = this->ItemsCount;
        if (iVar22 < this->ItemsCount) {
          iVar19 = iVar22;
        }
        this->DisplayEnd = iVar19;
        if (iVar21 < iVar12) {
          ImGuiListClipper_SeekCursorForItem(this,iVar18);
        }
        *(int *)((long)pvVar7 + 0xc) = *(int *)((long)pvVar7 + 0xc) + 1;
      }
      bVar27 = this->DisplayStart != this->DisplayEnd;
      goto LAB_001df1ea;
    }
  }
LAB_001deabe:
  bVar27 = false;
LAB_001df1ea:
  if (((pIVar10->CurrentTable != (ImGuiTable *)0x0) &&
      (pIVar10->CurrentTable->IsUnfrozenRows == false)) && ((pIVar10->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): inside frozen table row.\n");
  }
  if (((local_34 <= 0.0) && (0.0 < this->ItemsHeight)) && ((pIVar10->DebugLogFlags & 0x10) != 0)) {
    ImGui::DebugLog("Clipper: Step(): computed ItemsHeight: %.2f.\n",(double)this->ItemsHeight);
  }
  if (bVar27 == false) {
    if ((pIVar10->DebugLogFlags & 0x10U) != 0) {
      ImGui::DebugLog("Clipper: Step(): End.\n");
    }
    End(this);
  }
  else if ((pIVar10->DebugLogFlags & 0x10U) != 0) {
    ImGui::DebugLog("Clipper: Step(): display %d to %d.\n",(ulong)(uint)this->DisplayStart,
                    (ulong)(uint)this->DisplayEnd);
  }
  return bVar27;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    bool need_items_height = (ItemsHeight <= 0.0f);
    bool ret = ImGuiListClipper_StepInternal(this);
    if (ret && (DisplayStart == DisplayEnd))
        ret = false;
    if (g.CurrentTable && g.CurrentTable->IsUnfrozenRows == false)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): inside frozen table row.\n");
    if (need_items_height && ItemsHeight > 0.0f)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): computed ItemsHeight: %.2f.\n", ItemsHeight);
    if (ret)
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): display %d to %d.\n", DisplayStart, DisplayEnd);
    else
        IMGUI_DEBUG_LOG_CLIPPER("Clipper: Step(): End.\n");
    if (!ret)
        End();
    return ret;
}